

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O3

Gia_Man_t * Gia_ManRetimeForward(Gia_Man_t *p,int nMaxIters,int fVerbose)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  long lVar3;
  long lVar4;
  int level;
  Gia_Man_t *p_00;
  ulong uVar5;
  int nRegMoves;
  int nRegFixed;
  timespec ts;
  uint local_4c;
  int local_48;
  uint local_44;
  timespec local_40;
  
  local_4c = 1;
  pGVar2 = p;
  if (0 < nMaxIters) {
    uVar5 = 1;
    p_00 = p;
    local_48 = fVerbose;
    do {
      iVar1 = clock_gettime(3,&local_40);
      if (iVar1 < 0) {
        lVar3 = 1;
      }
      else {
        lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
        lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
      }
      pGVar2 = Gia_ManRetimeForwardOne(p_00,(int *)&local_44,(int *)&local_4c);
      if (local_48 != 0) {
        iVar1 = 0xa2bfab;
        printf("%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ",uVar5,
               (ulong)(uint)(~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs),
               (ulong)(uint)p_00->nRegs,(ulong)local_44,(ulong)local_4c);
        Abc_Print(iVar1,"%s =","Time");
        level = 3;
        iVar1 = clock_gettime(3,&local_40);
        if (iVar1 < 0) {
          lVar4 = -1;
        }
        else {
          lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
      }
      if (p_00 != p) {
        Gia_ManStop(p_00);
      }
    } while (((int)uVar5 < nMaxIters) &&
            (uVar5 = (ulong)((int)uVar5 + 1), p_00 = pGVar2, 0 < (int)local_4c));
  }
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManRetimeForward( Gia_Man_t * p, int nMaxIters, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    int i, nRegFixed, nRegMoves = 1;
    abctime clk;
    pNew = p;
    for ( i = 0; i < nMaxIters && nRegMoves > 0; i++ )
    {
        clk = Abc_Clock();
        pNew = Gia_ManRetimeForwardOne( pTemp = pNew, &nRegFixed, &nRegMoves );
        if ( fVerbose )
        {
            printf( "%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ", 
                i + 1, Gia_ManAndNum(pTemp), Gia_ManRegNum(pTemp), nRegFixed, nRegMoves );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( pTemp != p )
            Gia_ManStop( pTemp );
    }
/*
    clk = Abc_Clock();
    pNew = Gia_ManReduceLaches( pNew, fVerbose );
    if ( fVerbose )
    {
        ABC_PRT( "Register sharing time", Abc_Clock() - clk );
    }
*/
    return pNew;
}